

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O3

bool __thiscall StreamSummary<4U>::Add_Data(StreamSummary<4U> *this,Data<4U> *data)

{
  StreamCounter *counter;
  StreamBucket *prev;
  Node<Data<4U>_> *pNVar1;
  Node<Data<4U>_> *pNVar2;
  StreamCounter *pSVar3;
  Node<int> *pNVar4;
  Node<int> *pNVar5;
  iterator iVar6;
  mapped_type *ppSVar7;
  
  iVar6 = std::
          _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mp)._M_h,data);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    ppSVar7 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->mp,data);
    counter = *ppSVar7;
    prev = counter->parent;
    pNVar1 = (counter->super_Node<Data<4U>_>).prev;
    pNVar2 = (counter->super_Node<Data<4U>_>).next;
    if (pNVar1 != (Node<Data<4U>_> *)0x0) {
      pNVar1->next = pNVar2;
    }
    if (pNVar2 != (Node<Data<4U>_> *)0x0) {
      pNVar2->prev = pNVar1;
    }
    if (prev->child == counter) {
      pSVar3 = (StreamCounter *)(counter->super_Node<Data<4U>_>).next;
      prev->child = pSVar3;
      Add_Bucket(this,prev,counter);
      if (pSVar3 == (StreamCounter *)0x0) {
        pNVar4 = (prev->super_Node<int>).prev;
        pNVar5 = (prev->super_Node<int>).next;
        if (pNVar4 != (Node<int> *)0x0) {
          pNVar4->next = pNVar5;
        }
        if (pNVar5 != (Node<int> *)0x0) {
          pNVar5->prev = pNVar4;
        }
        operator_delete(prev,0x20);
      }
    }
    else {
      Add_Bucket(this,prev,counter);
    }
  }
  return iVar6.
         super__Node_iterator_base<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool Add_Data(const Data<DATA_LEN>& data) {
		if (mp.find(data) == mp.end()) return false;

		bool del = false;
		StreamCounter* temp = mp[data];
		StreamBucket* prev = temp->parent;
		temp->Delete();
		if (prev->child == temp) {
			prev->child = (StreamCounter*)temp->next;
			if (temp->next == NULL) del = true;
		}

		Add_Bucket(temp->parent, temp);

		if (del) {
			prev->Delete();
			delete prev;
		}

		return true;
	}